

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_udev.cc
# Opt level: O3

int __thiscall
ccel::udev::virtual_keyboard_handler::open
          (virtual_keyboard_handler *this,char *__file,int __oflag,...)

{
  int iVar1;
  ssize_t sVar2;
  int i;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  iVar1 = (*(this->super_base_handler)._vptr_base_handler[4])(this,__file,___oflag);
  iVar4 = 0;
  if ((char)iVar1 == '\0') {
    ioctl(this->_fd,0x40045565,0x39);
    uVar5 = 0;
    do {
      ioctl(this->_fd,0x40045565,uVar5);
      uVar3 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar3;
    } while (uVar3 != 0xf8);
    iVar4 = 0;
    ioctl(this->_fd,0x40045564,1);
    ioctl(this->_fd,0x40045564,2);
    memset(&this->_udev,0,0x45c);
    sVar2 = write(this->_fd,&this->_udev,0x45c);
    if (sVar2 < 0) {
      iVar4 = -1;
    }
    else {
      ioctl(this->_fd,0x5501);
      this->_open = true;
    }
  }
  return iVar4;
}

Assistant:

int virtual_keyboard_handler::open() {
  if (!this->opened()) { // If is not opened
    ioctl(_fd, UI_SET_KEYBIT, KEY_SPACE);
    for (auto i = 0; i < 248; i++) { // Bind and allow keycodes from 0 to 248
      ioctl(_fd, UI_SET_KEYBIT, i);
    }
    ioctl(_fd, UI_SET_EVBIT, EV_KEY);
    ioctl(_fd, UI_SET_EVBIT, EV_REL);
    _udev = uinput_user_dev{};
    if (write(_fd, &_udev, sizeof(_udev)) < 0)
      return -1;
    ioctl(_fd, UI_DEV_CREATE);
    _open = true;
  }
  return 0;
}